

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Icon2.cxx
# Opt level: O0

char * get_kde_val(char *str,char *key)

{
  size_t sVar1;
  char *local_20;
  char *key_local;
  char *str_local;
  
  local_20 = key;
  for (key_local = str; *key_local == *local_20; key_local = key_local + 1) {
    local_20 = local_20 + 1;
  }
  if ((*local_20 == '\0') && (*key_local == '=')) {
    sVar1 = strlen(key_local);
    if (key_local[sVar1 - 1] == '\n') {
      sVar1 = strlen(key_local);
      key_local[sVar1 - 1] = '\0';
    }
    str_local = key_local + 1;
  }
  else {
    str_local = (char *)0x0;
  }
  return str_local;
}

Assistant:

static char *
get_kde_val(char       *str,
            const char *key) {
  while (*str == *key) {
    str ++;
    key ++;
  }

  if (*key == '\0' && *str == '=') {
    if (str[strlen(str) - 1] == '\n') str[strlen(str) - 1] = '\0';

    return (str + 1);
  }

  return ((char *)0);
}